

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

void updatewindow(zng_stream *strm,uint8_t *end,uint32_t len,int32_t cksum)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  zng_stream *in_RSI;
  long in_RDI;
  uint32_t dist;
  inflate_state *state;
  uint local_28;
  uint32_t in_stack_ffffffffffffffdc;
  uint8_t *src;
  
  src = *(uint8_t **)(in_RDI + 0x38);
  if (*(int *)(src + 0x40) == 0) {
    *(int *)(src + 0x40) = 1 << ((byte)*(undefined4 *)(src + 0x3c) & 0x1f);
  }
  if (in_EDX < *(uint *)(src + 0x40)) {
    local_28 = *(int *)(src + 0x40) - *(int *)(src + 0x4c);
    if (in_EDX < local_28) {
      local_28 = in_EDX;
    }
    if (in_ECX == 0) {
      memcpy((void *)(*(long *)(src + 0x50) + (ulong)*(uint *)(src + 0x4c)),
             (void *)((long)in_RSI - (ulong)in_EDX),(ulong)local_28);
    }
    else {
      inf_chksum_cpy(in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX),src,local_28);
    }
    uVar1 = in_EDX - local_28;
    if (uVar1 == 0) {
      *(uint *)(src + 0x4c) = local_28 + *(int *)(src + 0x4c);
      if (*(int *)(src + 0x4c) == *(int *)(src + 0x40)) {
        src[0x4c] = '\0';
        src[0x4d] = '\0';
        src[0x4e] = '\0';
        src[0x4f] = '\0';
      }
      if (*(uint *)(src + 0x48) < *(uint *)(src + 0x40)) {
        *(uint *)(src + 0x48) = local_28 + *(int *)(src + 0x48);
      }
    }
    else {
      if (in_ECX == 0) {
        memcpy(*(void **)(src + 0x50),(void *)((long)in_RSI - (ulong)uVar1),(ulong)uVar1);
      }
      else {
        inf_chksum_cpy(in_RSI,(uint8_t *)CONCAT44(uVar1,in_ECX),src,local_28);
      }
      *(uint *)(src + 0x4c) = uVar1;
      *(undefined4 *)(src + 0x48) = *(undefined4 *)(src + 0x40);
    }
  }
  else {
    if (in_ECX == 0) {
      memcpy(*(void **)(src + 0x50),(void *)((long)in_RSI - (ulong)*(uint *)(src + 0x40)),
             (ulong)*(uint *)(src + 0x40));
    }
    else {
      if (*(uint *)(src + 0x40) < in_EDX) {
        inf_chksum(in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX),(uint32_t)((ulong)src >> 0x20));
      }
      inf_chksum_cpy(in_RSI,(uint8_t *)CONCAT44(in_EDX,in_ECX),src,in_stack_ffffffffffffffdc);
    }
    src[0x4c] = '\0';
    src[0x4d] = '\0';
    src[0x4e] = '\0';
    src[0x4f] = '\0';
    *(undefined4 *)(src + 0x48) = *(undefined4 *)(src + 0x40);
  }
  return;
}

Assistant:

static void updatewindow(PREFIX3(stream) *strm, const uint8_t *end, uint32_t len, int32_t cksum) {
    struct inflate_state *state;
    uint32_t dist;

    state = (struct inflate_state *)strm->state;

    /* if window not in use yet, initialize */
    if (state->wsize == 0)
        state->wsize = 1U << state->wbits;

    /* len state->wsize or less output bytes into the circular window */
    if (len >= state->wsize) {
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * it (s/390 being the primary exception to this) */
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            /* We have to split the checksum over non-copied and copied bytes */
            if (len > state->wsize)
                inf_chksum(strm, end - len, len - state->wsize);
            inf_chksum_cpy(strm, state->window, end - state->wsize, state->wsize);
        } else {
            memcpy(state->window, end - state->wsize, state->wsize);
        }

        state->wnext = 0;
        state->whave = state->wsize;
    } else {
        dist = state->wsize - state->wnext;
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * We need to maintain the correct order here for the checksum */
        dist = MIN(dist, len);
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            inf_chksum_cpy(strm, state->window + state->wnext, end - len, dist);
        } else {
            memcpy(state->window + state->wnext, end - len, dist);
        }
        len -= dist;
        if (len) {
            if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
                inf_chksum_cpy(strm, state->window, end - len, len);
            } else {
                memcpy(state->window, end - len, len);
            }

            state->wnext = len;
            state->whave = state->wsize;
        } else {
            state->wnext += dist;
            if (state->wnext == state->wsize)
                state->wnext = 0;
            if (state->whave < state->wsize)
                state->whave += dist;
        }
    }
}